

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O2

void generate_room(chunk *c,wchar_t y1,wchar_t x1,wchar_t y2,wchar_t x2,wchar_t light)

{
  square *psVar1;
  wchar_t wVar2;
  loc grid;
  
  for (; wVar2 = x1, y1 <= y2; y1 = y1 + L'\x01') {
    for (; wVar2 <= x2; wVar2 = wVar2 + L'\x01') {
      grid.y = y1;
      grid.x = wVar2;
      psVar1 = square((chunk_conflict *)c,grid);
      flag_on_dbg(psVar1->info,3,4,"square(c, grid)->info","SQUARE_ROOM");
      if (light != L'\0') {
        psVar1 = square((chunk_conflict *)c,grid);
        flag_on_dbg(psVar1->info,3,2,"square(c, grid)->info","SQUARE_GLOW");
      }
    }
  }
  return;
}

Assistant:

static void generate_room(struct chunk *c, int y1, int x1, int y2, int x2,
						  int light)
{
	struct loc grid;
	for (grid.y = y1; grid.y <= y2; grid.y++)
		for (grid.x = x1; grid.x <= x2; grid.x++) {
			sqinfo_on(square(c, grid)->info, SQUARE_ROOM);
			if (light)
				sqinfo_on(square(c, grid)->info, SQUARE_GLOW);
		}
}